

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngineTrace.cpp
# Opt level: O0

int __thiscall llbuild::core::BuildEngineTrace::close(BuildEngineTrace *this,int __fd)

{
  FILE *__stream;
  bool bVar1;
  int iVar2;
  undefined7 extraout_var;
  ulong uVar3;
  undefined4 in_register_00000034;
  bool success;
  FILE *fp;
  string *error_out_local;
  BuildEngineTrace *this_local;
  
  bVar1 = isOpen(this);
  if (!bVar1) {
    __assert_fail("isOpen()",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/BuildEngineTrace.cpp"
                  ,0x31,"bool llbuild::core::BuildEngineTrace::close(std::string *)");
  }
  __stream = (FILE *)this->outputPtr;
  fprintf(__stream,"]\n");
  iVar2 = fclose(__stream);
  this->outputPtr = (void *)0x0;
  bVar1 = isOpen(this);
  uVar3 = CONCAT71(extraout_var,bVar1) ^ 0xff;
  if ((uVar3 & 1) != 0) {
    if (iVar2 != 0) {
      uVar3 = std::__cxx11::string::operator=
                        ((string *)CONCAT44(in_register_00000034,__fd),"unable to close file");
    }
    return (int)CONCAT71((int7)(uVar3 >> 8),iVar2 == 0);
  }
  __assert_fail("!isOpen()",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/BuildEngineTrace.cpp"
                ,0x3a,"bool llbuild::core::BuildEngineTrace::close(std::string *)");
}

Assistant:

bool BuildEngineTrace::close(std::string* error_out) {
  assert(isOpen());

  FILE *fp = static_cast<FILE*>(outputPtr);

  // Write the footer.
  fprintf(fp, "]\n");

  bool success = fclose(fp) == 0;
  outputPtr = nullptr;
  assert(!isOpen());

  if (!success) {
    *error_out = "unable to close file";
    return false;
  }

  return true;
}